

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O1

void __thiscall
mognetwork::Packet::reinitialize(Packet *this,vector<char,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  ReadedDatas *pRVar2;
  
  this->m_readerPos = 0;
  pRVar2 = this->m_dataPack;
  if (pRVar2 == (ReadedDatas *)0x0) {
    pRVar2 = (ReadedDatas *)this->m_data;
    if (pRVar2 == (ReadedDatas *)0x0) goto LAB_0010b727;
    pcVar1 = (pointer)pRVar2->readed;
  }
  else {
    pcVar1 = (pRVar2->datas).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  operator_delete(pRVar2);
LAB_0010b727:
  this->m_dataPack = (ReadedDatas *)0x0;
  this->m_data = data;
  return;
}

Assistant:

void Packet::reinitialize(std::vector<char>* data)
  {
    m_readerPos = 0;
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
    m_dataPack = NULL;
    m_data = data;    
  }